

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.h
# Opt level: O2

void __thiscall
Assimp::ObjExporter::
indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare>::getKeys
          (indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare> *this,
          vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
          *keys)

{
  pointer pvVar1;
  undefined4 uVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  
  std::vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>::
  resize(keys,(this->vecMap)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var3 = (this->vecMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->vecMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    lVar4 = (long)*(int *)&p_Var3[1]._M_right;
    pvVar1 = (keys->
             super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar1[lVar4 + -1].vp.z = *(float *)&p_Var3[1]._M_parent;
    uVar2 = *(undefined4 *)&p_Var3[1].field_0x4;
    pvVar1[lVar4 + -1].vp.x = (float)p_Var3[1]._M_color;
    pvVar1[lVar4 + -1].vp.y = (float)uVar2;
    pvVar1[lVar4 + -1].vc.r = *(ai_real *)((long)&p_Var3[1]._M_parent + 4);
    pvVar1[lVar4 + -1].vc.g = *(ai_real *)&p_Var3[1]._M_left;
    pvVar1[lVar4 + -1].vc.b = *(ai_real *)((long)&p_Var3[1]._M_left + 4);
  }
  return;
}

Assistant:

void getKeys( std::vector<T>& keys ) {
            keys.resize(vecMap.size());
            for(typename dataType::iterator it = vecMap.begin(); it != vecMap.end(); ++it){
                keys[it->second-1] = it->first;
            }
        }